

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O2

void Omega_h::separate_upward_with_codes
               (LO nlh,LOs *lh2hl,Int nlows_per_high,Write<int> *lh2h,Bytes *down_codes,
               Write<signed_char> *codes)

{
  int iVar1;
  ulong uVar2;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  allocator local_121;
  undefined1 local_120 [32];
  long local_100;
  Write<signed_char> local_f8;
  Write<signed_char> local_e8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  type f;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,(allocator *)&local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,&local_b8,
                 ":");
  std::__cxx11::to_string(&local_d8,0xcd);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,&local_d8);
  begin_code("separate_upward_with_codes",(char *)local_120._0_8_);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&local_b8);
  Write<int>::Write((Write<int> *)&f,&lh2hl->write_);
  f.nlows_per_high = nlows_per_high;
  Write<int>::Write(&f.lh2h,lh2h);
  Write<signed_char>::Write(&f.down_codes.write_,&down_codes->write_);
  Write<signed_char>::Write(&f.codes,codes);
  std::__cxx11::string::string
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,&local_121);
  std::operator+(&local_b8,&local_d8,":");
  std::__cxx11::to_string(&local_50,0x54);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 &local_b8,&local_50);
  begin_code("parallel_for",(char *)local_120._0_8_);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (0 < nlh) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)local_120,(Write<int> *)&f);
    local_120._16_4_ = f.nlows_per_high;
    Write<int>::Write((Write<int> *)(local_120 + 0x18),&f.lh2h);
    Write<signed_char>::Write(&local_f8,&f.down_codes.write_);
    Write<signed_char>::Write(&local_e8,&f.codes);
    entering_parallel = 0;
    for (uVar2 = 0; (uint)nlh != uVar2; uVar2 = uVar2 + 1) {
      iVar1 = *(int *)(local_120._8_8_ + uVar2 * 4);
      *(int *)(local_100 + uVar2 * 4) = iVar1 / (int)local_120._16_4_;
      *(byte *)((long)local_e8.shared_alloc_.direct_ptr + uVar2) =
           *(byte *)((long)local_f8.shared_alloc_.direct_ptr + (long)iVar1) & 7 |
           (char)(iVar1 % (int)local_120._16_4_) << 3;
    }
    separate_upward_with_codes(int,Omega_h::Read<int>,int,Omega_h::Write<int>,Omega_h::Read<signed_char>,Omega_h::Write<signed_char>)
    ::$_0::~__0((__0 *)local_120);
  }
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer_1);
  separate_upward_with_codes(int,Omega_h::Read<int>,int,Omega_h::Write<int>,Omega_h::Read<signed_char>,Omega_h::Write<signed_char>)
  ::$_0::~__0((__0 *)&f);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return;
}

Assistant:

void separate_upward_with_codes(LO const nlh, LOs const lh2hl,
    Int const nlows_per_high, Write<LO> const lh2h, Bytes const down_codes,
    Write<Byte> const codes) {
  OMEGA_H_TIME_FUNCTION;
  auto f = OMEGA_H_LAMBDA(LO lh) {
    LO const hl = lh2hl[lh];
    LO const h = hl / nlows_per_high;
    lh2h[lh] = h;
    Int const which_down = hl % nlows_per_high;
    auto const down_code = down_codes[hl];
    bool const is_flipped = code_is_flipped(down_code);
    Int const rotation = code_rotation(down_code);
    codes[lh] = make_code(is_flipped, rotation, which_down);
  };
  parallel_for(nlh, std::move(f));
}